

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

void __thiscall
TTD::ExecutionInfoManager::AddCurrentLocationDuringScan
          (ExecutionInfoManager *this,int64 topLevelEventTime)

{
  bool bVar1;
  SingleCallCounter *callFrame;
  undefined1 local_58 [8];
  TTDebuggerSourceLocation current;
  
  TTDebuggerSourceLocation::TTDebuggerSourceLocation((TTDebuggerSourceLocation *)local_58);
  callFrame = JsUtil::
              List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Last(&this->m_callStack);
  TTDebuggerSourceLocation::SetLocationFromFrame
            ((TTDebuggerSourceLocation *)local_58,topLevelEventTime,callFrame);
  if ((this->m_activeTTDBP).m_sourceScriptLogId != 0) {
    bVar1 = TTDebuggerSourceLocation::AreSameLocations
                      (&this->m_activeTTDBP,(TTDebuggerSourceLocation *)local_58);
    if (bVar1) {
      this->m_hitContinueSearchBP = true;
    }
  }
  if (this->m_hitContinueSearchBP == false) {
    bVar1 = IsLocationActiveBPAndNotExplicitBP(this,(TTDebuggerSourceLocation *)local_58);
    if (!bVar1) {
      TTDebuggerSourceLocation::SetLocationCopy
                (&this->m_continueBreakPoint,(TTDebuggerSourceLocation *)local_58);
    }
  }
  TTDebuggerSourceLocation::~TTDebuggerSourceLocation((TTDebuggerSourceLocation *)local_58);
  return;
}

Assistant:

void ExecutionInfoManager::AddCurrentLocationDuringScan(int64 topLevelEventTime)
    {
        TTDebuggerSourceLocation current;
        current.SetLocationFromFrame(topLevelEventTime, this->m_callStack.Last());

        if(this->m_activeTTDBP.HasValue() && TTDebuggerSourceLocation::AreSameLocations(this->m_activeTTDBP, current))
        {
            this->m_hitContinueSearchBP = true;
        }

        if(!this->m_hitContinueSearchBP && !this->IsLocationActiveBPAndNotExplicitBP(current))
        {
            this->m_continueBreakPoint.SetLocationCopy(current);
        }
    }